

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::
SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
::Exec(SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
       *this,Matcher *matcher,Char *input,CharCount inputLength,CharCount *matchStart,
      CharCount *inputOffset,CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack
      ,AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  bool bVar1;
  CharCount CVar2;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
  *this_local;
  
  bVar1 = ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>::Match
                    (&this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>,matcher
                     ,input,inputLength,inputOffset);
  if (bVar1) {
    *matchStart = *inputOffset;
    CVar2 = ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>::GetLiteralLength
                      (&this->super_ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>);
    *inputOffset = CVar2 + *inputOffset;
    *instPointer = *instPointer + 0x449;
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         Matcher::HardFail(matcher,input,inputLength,matchStart,inputOffset,instPointer,contStack,
                           assertionStack,qcTicks,ImmediateFail);
  }
  return this_local._7_1_;
}

Assistant:

inline bool SyncToLiteralAndConsumeInstT<ScannerT>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (!this->Match(matcher, input, inputLength, inputOffset))
        {
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        matchStart = inputOffset;
        inputOffset += ScannerT::GetLiteralLength();
        instPointer += sizeof(*this);
        return false;
    }